

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::initialize(DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
             *this)

{
  int iVar1;
  undefined4 extraout_var;
  Counter symCounter;
  ArgExprs args;
  ExpandContext ctx;
  SharedPtr<const_vkt::shaderexecutor::Variable<float>_> local_d8;
  vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_> local_c8
  ;
  undefined4 local_ac;
  SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> local_a8;
  SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> local_98;
  Tuple4<vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
  local_80;
  undefined4 *local_40;
  vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_> local_38
  ;
  string *name;
  
  if ((this->m_ret).super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_ptr == (Expr<float> *)0x0) {
    iVar1 = (*(this->
              super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              ).super_FuncBase._vptr_FuncBase[10])();
    name = (string *)CONCAT44(extraout_var,iVar1);
    local_40 = &local_ac;
    local_ac = 0;
    local_38.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.m_ptr = (Variable<float> *)0x0;
    local_d8.m_state = (SharedPtrStateBase *)0x0;
    local_98.m_ptr = (Expr<vkt::shaderexecutor::Void> *)0x0;
    local_98.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = (Expr<vkt::shaderexecutor::Void> *)0x0;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    Tuple4<vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
    ::Tuple4(&local_80,(ExprP<float> *)&local_c8,(ExprP<float> *)&local_d8,
             (ExprP<vkt::shaderexecutor::Void> *)&local_98,
             (ExprP<vkt::shaderexecutor::Void> *)&local_a8);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::release(&local_a8);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::release(&local_98);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release
              ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_d8);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release
              ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_c8);
    variable<float>((shaderexecutor *)&local_d8,name);
    de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator=
              (&(this->m_var0).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>,
               &local_d8);
    VariableP::operator_cast_to_ExprP((VariableP *)&local_c8);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::operator=
              ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_80,
               (SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_c8);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release
              ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_c8);
    de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::release(&local_d8);
    variable<float>((shaderexecutor *)&local_d8,name + 1);
    de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator=
              (&(this->m_var1).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>,
               &local_d8);
    VariableP::operator_cast_to_ExprP((VariableP *)&local_c8);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::operator=
              ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_80.b,
               (SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_c8);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release
              ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_c8);
    de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::release(&local_d8);
    variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_d8,name + 2);
    de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::operator=
              (&(this->m_var2).
                super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>,
               (SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_> *)
               &local_d8);
    VariableP::operator_cast_to_ExprP((VariableP *)&local_c8);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::operator=
              ((SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)&local_80.c
               ,(SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)&local_c8)
    ;
    de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::release
              ((SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)&local_c8);
    de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::release
              ((SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_> *)
               &local_d8);
    variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_d8,name + 3);
    de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::operator=
              (&(this->m_var3).
                super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>,
               (SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_> *)
               &local_d8);
    VariableP::operator_cast_to_ExprP((VariableP *)&local_c8);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::operator=
              ((SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)&local_80.d
               ,(SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)&local_c8)
    ;
    de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::release
              ((SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)&local_c8);
    de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::release
              ((SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_> *)
               &local_d8);
    (*(this->
      super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      ).super_FuncBase._vptr_FuncBase[0xb])(&local_c8,this,&local_40,&local_80);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::operator=
              ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&this->m_ret,
               (SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_c8);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release
              ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_c8);
    std::vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>::
    vector(&local_c8,&local_38);
    std::vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>::
    _M_move_assign(&this->m_body,&local_c8);
    std::vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>::
    ~vector(&local_c8);
    Tuple4<vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
    ::~Tuple4(&local_80);
    std::vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>::
    ~vector(&local_38);
  }
  return;
}

Assistant:

const Void&			operator[]		(int)	const	{ return *this; }